

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

art_node4_t * art_node4_create(art_t *art,art_key_chunk_t *prefix,uint8_t prefix_size)

{
  undefined1 *puVar1;
  art_node_t *paVar2;
  uint64_t uVar3;
  undefined7 in_register_00000011;
  ulong __n;
  
  __n = CONCAT71(in_register_00000011,prefix_size) & 0xffffffff;
  uVar3 = art_allocate_index(art,'\x02');
  paVar2 = art->nodes[2];
  puVar1 = (undefined1 *)((long)paVar2 + uVar3 * 0x30);
  *puVar1 = (char)__n;
  memcpy(puVar1 + 1,prefix,__n);
  puVar1[6] = 0;
  return (art_node4_t *)((long)paVar2 + uVar3 * 0x30);
}

Assistant:

static art_node4_t *art_node4_create(art_t *art, const art_key_chunk_t prefix[],
                                     uint8_t prefix_size) {
    uint64_t index = art_allocate_index(art, CROARING_ART_NODE4_TYPE);
    art_node4_t *node =
        ((art_node4_t *)art->nodes[CROARING_ART_NODE4_TYPE]) + index;
    art_init_inner_node(&node->base, prefix, prefix_size);
    node->count = 0;
    return node;
}